

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_util.hpp
# Opt level: O0

string * rest_rpc::get_error_msg_abi_cxx11_(string_view result)

{
  __tuple_element_t<1UL,_tuple<int,_basic_string<char>_>_> *p_Var1;
  char *in_RDX;
  const_pointer in_RSI;
  string *in_RDI;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tp;
  msgpack_codec codec;
  string *this;
  
  this = in_RDI;
  rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x29c62a);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  rpc_service::msgpack_codec::unpack<std::tuple<int,std::__cxx11::string>>
            ((msgpack_codec *)this,in_RDX,(size_t)in_RSI);
  p_Var1 = std::get<1ul,int,std::__cxx11::string>
                     ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x29c66e);
  std::__cxx11::string::string(in_RDI,(string *)p_Var1);
  std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x29c686);
  rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x29c690);
  return in_RDI;
}

Assistant:

inline std::string get_error_msg(string_view result) {
  rpc_service::msgpack_codec codec;
  auto tp =
      codec.unpack<std::tuple<int, std::string>>(result.data(), result.size());
  return std::get<1>(tp);
}